

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

Int64Parameter * __thiscall
CoreML::Specification::NetworkUpdateParameters::mutable_epochs(NetworkUpdateParameters *this)

{
  Int64Parameter *this_00;
  NetworkUpdateParameters *this_local;
  
  if (this->epochs_ == (Int64Parameter *)0x0) {
    this_00 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_00);
    this->epochs_ = this_00;
  }
  return this->epochs_;
}

Assistant:

inline ::CoreML::Specification::Int64Parameter* NetworkUpdateParameters::mutable_epochs() {
  
  if (epochs_ == NULL) {
    epochs_ = new ::CoreML::Specification::Int64Parameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NetworkUpdateParameters.epochs)
  return epochs_;
}